

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

size_t __thiscall TcpSocketImpl::Write(TcpSocketImpl *this,void *buf,size_t len)

{
  int iVar1;
  size_t sVar2;
  unsigned_long __n2;
  __array tmp;
  size_t len_local;
  
  if ((this->super_BaseSocketImpl).m_bStop == false) {
    sVar2 = 0;
    if (((len != 0) && (buf != (void *)0x0)) && (sVar2 = 0, this->m_bCloseReq == false)) {
      len_local = len;
      if (BaseSocketImpl::s_fTrafficDebug.super__Function_base._M_manager != (_Manager_type)0x0) {
        std::function<void_(unsigned_short,_const_char_*,_unsigned_long,_bool)>::operator()
                  (&BaseSocketImpl::s_fTrafficDebug,
                   (unsigned_short)(this->super_BaseSocketImpl).m_fSock,(char *)buf,len,true);
      }
      if (((this->m_fnSslInitDone).super__Function_base._M_manager == (_Manager_type)0x0) ||
         (iVar1 = std::function<int_()>::operator()(&this->m_fnSslInitDone), iVar1 == 1)) {
        if (((this->m_fnSslEncode).super__Function_base._M_manager == (_Manager_type)0x0) ||
           (iVar1 = std::function<int_(const_unsigned_char_*,_unsigned_long)>::operator()
                              (&this->m_fnSslEncode,(uchar *)buf,len), iVar1 == 0)) {
          tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
               (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
               operator_new__(len);
          memcpy((void *)tmp._M_t.
                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                         .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,buf,len);
          std::mutex::lock(&this->m_mxOutDeque);
          LOCK();
          (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i =
               (this->m_atOutBytes).super___atomic_base<unsigned_long>._M_i + len_local;
          UNLOCK();
          std::
          deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
          ::
          emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&>
                    ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                      *)&this->m_quOutData,&tmp,&len_local);
          pthread_mutex_unlock((pthread_mutex_t *)&this->m_mxOutDeque);
          std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&tmp)
          ;
        }
        else if (iVar1 < 1) {
          return len;
        }
        TriggerWriteThread(this);
        sVar2 = len_local;
      }
      else {
        tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
             (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
             operator_new__(len);
        memcpy((void *)tmp._M_t.
                       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                       .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,buf,len);
        std::mutex::lock(&this->m_mxOutDeque);
        std::
        deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
        ::
        emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&>
                  ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                    *)&this->m_quTmpOutData,&tmp,&len_local);
        sVar2 = len_local;
        pthread_mutex_unlock((pthread_mutex_t *)&this->m_mxOutDeque);
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&tmp);
      }
    }
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

size_t TcpSocketImpl::Write(const void* buf, size_t len)
{
    if (m_bStop == true || m_bCloseReq == true || buf == nullptr || len == 0)
        return 0;

    if (s_fTrafficDebug != nullptr)
        s_fTrafficDebug(static_cast<uint16_t>(m_fSock), static_cast<const char*>(buf), len, true);

    if (m_fnSslInitDone != nullptr && m_fnSslInitDone() != 1)
    {
        auto tmp = make_unique<uint8_t[]>(len);
        copy_n(&static_cast<const uint8_t*>(buf)[0], len, &tmp[0]);
        lock_guard<mutex> lock(m_mxOutDeque);
        m_quTmpOutData.emplace_back(move(tmp), len);
        return len;
    }

    int iRet = 0;
    if (m_fnSslEncode == nullptr || (iRet = m_fnSslEncode(reinterpret_cast<const uint8_t*>(buf), len), iRet == 0))
    {
        auto tmp = make_unique<uint8_t[]>(len);
        copy_n(&static_cast<const uint8_t*>(buf)[0], len, &tmp[0]);
        m_mxOutDeque.lock();
        m_atOutBytes += len;
        m_quOutData.emplace_back(move(tmp), len);
        m_mxOutDeque.unlock();

        iRet = 1;   // Trigger WriteThread
    }

    if (iRet > 0)
        TriggerWriteThread();

    return len;
}